

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

int ndn_forwarder_unregister_face(ndn_face_intf_t *face)

{
  ndn_face_intf_t *face_local;
  
  if (face == (ndn_face_intf_t *)0x0) {
    face_local._4_4_ = -0x10;
  }
  else if (face->face_id == 0xffff) {
    face_local._4_4_ = -0x32;
  }
  else if (face->face_id < (forwarder.facetab)->capacity) {
    ndn_fib_unregister_face(forwarder.fib,face->face_id);
    ndn_pit_unregister_face(forwarder.pit,face->face_id);
    ndn_facetab_unregister(forwarder.facetab,face->face_id);
    face->face_id = 0xffff;
    face_local._4_4_ = 0;
  }
  else {
    face_local._4_4_ = -0x36;
  }
  return face_local._4_4_;
}

Assistant:

int
ndn_forwarder_unregister_face(ndn_face_intf_t* face)
{
  if(face == NULL)
    return NDN_INVALID_POINTER;
  if(face->face_id == NDN_INVALID_ID)
    return NDN_FWD_NO_EFFECT;
  if(face->face_id >= forwarder.facetab->capacity)
    return NDN_FWD_INVALID_FACE;
  ndn_fib_unregister_face(forwarder.fib, face->face_id);
  ndn_pit_unregister_face(forwarder.pit, face->face_id);
  ndn_facetab_unregister(forwarder.facetab, face->face_id);
  face->face_id = NDN_INVALID_ID;
  return NDN_SUCCESS;
}